

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::junit_reporter::do_suite_complete(junit_reporter *this)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *poVar2;
  difference_type dVar3;
  undefined8 uVar4;
  __node_base *p_Var5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  tc;
  undefined1 local_118 [40];
  string local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  local_d0;
  
  if (this->verbose == true) {
    std::operator<<((ostream *)&std::cout,"\ngenerating JUnit report\n");
  }
  this_00 = &(this->super_reporter).os;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar1,"<?xml version=\"1.0\" encoding=\"utf-8\"?>\n");
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  poVar2 = std::operator<<(pbVar1,"<testsuite name=\"");
  escape(&local_d0.first,&this->title);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2,"\" tests=\"");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\"");
  std::__cxx11::string::~string((string *)&local_d0);
  dVar3 = std::
          __count_if<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,nonius::junit_reporter::result>,false,true>,__gnu_cxx::__ops::_Iter_pred<nonius::junit_reporter::do_suite_complete()::_lambda(std::pair<std::__cxx11::string_const&,nonius::junit_reporter::result>const&)_1_>>
                    ((this->data)._M_h._M_before_begin._M_nxt,0);
  if (0 < dVar3) {
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    poVar2 = std::operator<<(pbVar1," errors=\"");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,"\"");
  }
  p_Var5 = &(this->data)._M_h._M_before_begin;
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar1,">\n");
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar1," <properties>\n");
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  poVar2 = std::operator<<(pbVar1,"  <property name=\"samples\" value=\"");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->n_samples);
  std::operator<<(poVar2,"\">\n");
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  poVar2 = std::operator<<(pbVar1,"  <property name=\"confidence_interval\" value=\"");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 3;
  poVar2 = std::ostream::_M_insert<double>(this->confidence_interval);
  std::operator<<(poVar2,"\">\n");
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  poVar2 = std::operator<<(pbVar1,"  <property name=\"resamples\" value=\"");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->resamples);
  std::operator<<(poVar2,"\">\n");
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar1," </properties>\n");
  while( true ) {
    p_Var5 = p_Var5->_M_nxt;
    if (p_Var5 == (__node_base *)0x0) {
      pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                         (this_00);
      std::operator<<(pbVar1,"</testsuite>\n");
      std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00);
      std::ostream::flush();
      if (this->verbose != false) {
        std::operator<<((ostream *)&std::cout,"done\n");
      }
      return;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
    ::pair(&local_d0,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
            *)(p_Var5 + 1));
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    poVar2 = std::operator<<(pbVar1," <testcase name=\"");
    escape(&local_f0,&local_d0.first);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::~string((string *)&local_f0);
    if (local_d0.second.failure._M_exception_object != (void *)0x0) break;
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    *(uint *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 0x18) =
         *(uint *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    *(undefined8 *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18) + 8) = 0xf;
    pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (this_00);
    std::operator<<(pbVar1," time=\"");
    poVar2 = std::ostream::_M_insert<double>(local_d0.second.analysis.mean.point.__r);
    std::operator<<(poVar2,"\" />\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
    ::~pair(&local_d0);
  }
  pbVar1 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()(this_00)
  ;
  std::operator<<(pbVar1,">\n");
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)local_118,&local_d0.second.failure);
  uVar4 = std::rethrow_exception((exception_ptr)local_118);
  __cxa_end_catch();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>
  ::~pair(&local_d0);
  _Unwind_Resume(uVar4);
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating JUnit report\n";

            report_stream() << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n";
            report_stream() << "<testsuite name=\"" << escape(title) << "\" tests=\"" << data.size() << "\"";
            auto failures = std::count_if(data.begin(), data.end(),
                    [](std::pair<std::string const&, result> const& p) {
                        return static_cast<bool>(p.second.failure);
                    });
            if(failures > 0) report_stream() << " errors=\"" << failures << "\"";
            report_stream() << ">\n";

            report_stream() << " <properties>\n";
            report_stream() << "  <property name=\"samples\" value=\"" << n_samples << "\">\n";
            report_stream() << "  <property name=\"confidence_interval\" value=\"" << std::setprecision(3) << confidence_interval << "\">\n";
            report_stream() << "  <property name=\"resamples\" value=\"" << resamples << "\">\n";
            report_stream() << " </properties>\n";

            for(auto tc : data) {
                report_stream() << " <testcase name=\"" << escape(tc.first) << "\"";
                if(tc.second.failure) {
                    report_stream() << ">\n";
                    try {
                        std::rethrow_exception(tc.second.failure);
                    } catch(std::exception const& e) {
                        report_stream() << "  <error message=\"" << escape(e.what()) << "\" />\n";
                    } catch(...) {
                        report_stream() << "  <error message=\"unknown error\" />\n";
                    }
                    report_stream() << " </testcase>\n";
                } else {
                    report_stream() << std::fixed;
                    report_stream().precision(std::numeric_limits<double>::digits10);
                    report_stream() << " time=\"" << tc.second.analysis.mean.point.count() << "\" />\n";
                }
            }

            report_stream() << "</testsuite>\n";

            report_stream() << std::flush;

            if(verbose) progress_stream() << "done\n";
        }